

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaDDir.cpp
# Opt level: O2

void __thiscall NaDataDirector::StartEpoch(NaDataDirector *this,NaDataDirIterKind ik)

{
  uint uVar1;
  uint uVar2;
  bool *pbVar3;
  uint i;
  ulong uVar4;
  
  if (ik == ddikRandomized) {
    this->eIterKind = ddikRandomized;
    this->nIterDone = 0;
    this->iIndex = 0;
    uVar1 = this->nDataVolume;
    uVar2 = this->nFeedbackDepth;
    pbVar3 = this->bUsed;
    for (uVar4 = 0; uVar1 - uVar2 != uVar4; uVar4 = uVar4 + 1) {
      pbVar3[uVar4] = false;
    }
  }
  else if (ik == ddikSequence) {
    this->eIterKind = ddikSequence;
    this->nIterDone = 0;
    this->iIndex = 0;
  }
  return;
}

Assistant:

void        NaDataDirector::StartEpoch (NaDataDirIterKind ik)
{
    switch(ik){

    case ddikSequence:
        eIterKind = ik;
        iIndex = nIterDone = 0;
        break;

    case ddikRandomized:
        eIterKind = ik;
        iIndex = nIterDone = 0;
        for(unsigned i = 0; i < GetEpochLen(); ++i){
            bUsed[i] = false;
        }
        break;
    }
}